

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  undefined8 uVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  if (align_corner == 0) {
    dVar12 = (double)w;
    dVar13 = (double)outw;
  }
  else {
    dVar12 = (double)(w + -1);
    dVar13 = (double)(outw + -1);
  }
  if (0 < outw) {
    pfVar10 = alpha + 3;
    uVar11 = 0;
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    do {
      dVar2 = ((double)(int)uVar11 + 0.5) * (dVar12 / dVar13) + -0.5;
      if (align_corner != 0) {
        dVar2 = (double)(int)uVar11 * (dVar12 / dVar13);
      }
      auVar15._0_4_ = (float)dVar2;
      auVar15._4_4_ = (int)((ulong)dVar2 >> 0x20);
      auVar15._8_8_ = 0;
      auVar6 = vroundss_avx(auVar15,auVar15,9);
      iVar8 = (int)auVar6._0_4_;
      auVar18._0_4_ = auVar15._0_4_ - auVar6._0_4_;
      fVar7 = 1.0 - auVar18._0_4_;
      auVar6 = vblendps_avx(ZEXT416((uint)((auVar18._0_4_ + 1.0) * -6.0 + 3.0)),auVar14,0xe);
      auVar15 = vinsertps_avx(ZEXT416((uint)(auVar18._0_4_ + 1.0)),ZEXT416((uint)auVar18._0_4_),0x10
                             );
      auVar18._0_4_ = auVar15._0_4_;
      fVar3 = auVar15._4_4_;
      fVar4 = auVar15._8_4_;
      fVar5 = auVar15._12_4_;
      auVar16._0_4_ = auVar18._0_4_ * 0.75;
      auVar16._4_4_ = fVar3 * 1.25;
      auVar16._8_4_ = fVar4 * 0.0;
      auVar16._12_4_ = fVar5 * 0.0;
      auVar15 = vsubps_avx(SUB6416(ZEXT464(0x40700000),0),auVar16);
      auVar17._0_4_ = auVar16._0_4_ + -2.25;
      auVar17._4_4_ = auVar16._4_4_ + -2.25;
      auVar17._8_4_ = auVar16._8_4_ + -2.25;
      auVar17._12_4_ = auVar16._12_4_ + -2.25;
      auVar15 = vblendps_avx(auVar15,auVar17,2);
      auVar18._0_4_ = auVar18._0_4_ * auVar18._0_4_ * auVar15._0_4_ + auVar6._0_4_;
      auVar18._4_4_ = fVar3 * fVar3 * auVar15._4_4_ + auVar6._4_4_;
      auVar18._8_4_ = fVar4 * fVar4 * auVar15._8_4_ + auVar6._8_4_;
      auVar18._12_4_ = fVar5 * fVar5 * auVar15._12_4_ + auVar6._12_4_;
      uVar1 = vmovlps_avx(auVar18);
      *(undefined8 *)(pfVar10 + -3) = uVar1;
      fVar3 = fVar7 * fVar7 * (fVar7 * 1.25 + -2.25);
      pfVar10[-1] = fVar3 + 1.0;
      auVar6 = vmovshdup_avx(auVar18);
      *pfVar10 = -(auVar18._0_4_ + fVar3 + auVar6._0_4_);
      if (iVar8 < 0) {
        pfVar9 = alpha + uVar11 * 4 + 3;
        auVar18._0_4_ = 1.0 - *pfVar10;
        pfVar10[-3] = auVar18._0_4_;
        pfVar10[-2] = *pfVar10;
        pfVar10[-1] = 0.0;
LAB_0045b44b:
        *pfVar9 = 0.0;
        iVar8 = 1;
      }
      else if (iVar8 == 0) {
        auVar18._0_4_ = auVar18._0_4_ + pfVar10[-2];
        pfVar10[-3] = auVar18._0_4_;
        *(undefined8 *)(pfVar10 + -2) = *(undefined8 *)(pfVar10 + -1);
        pfVar9 = pfVar10;
        goto LAB_0045b44b;
      }
      if (iVar8 == w + -2) {
        *pfVar10 = *pfVar10 + pfVar10[-1];
        pfVar10[-1] = pfVar10[-2];
        pfVar10[-2] = auVar18._0_4_;
LAB_0045b49b:
        pfVar10[-3] = 0.0;
        iVar8 = w + -3;
      }
      else if (w + -1 <= iVar8) {
        *pfVar10 = 1.0 - auVar18._0_4_;
        pfVar10[-1] = auVar18._0_4_;
        pfVar10[-2] = 0.0;
        goto LAB_0045b49b;
      }
      xofs[uVar11] = iVar8;
      uVar11 = uVar11 + 1;
      pfVar10 = pfVar10 + 4;
    } while ((uint)outw != uVar11);
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = static_cast<float>(dx * scale);
        }

        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx * 4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx * 4 + 0] = 1.f - alpha[dx * 4 + 3];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = 0.f;
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx * 4 + 0] = alpha[dx * 4 + 0] + alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 2];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = alpha[dx * 4 + 2] + alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = 1.f - alpha[dx * 4 + 0];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 1] = 0.f;
            alpha[dx * 4 + 0] = 0.f;
        }

        xofs[dx] = sx;
    }
}